

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

bool __thiscall Tester::testDirectory(Tester *this,string *path)

{
  double __x;
  bool bVar1;
  path *this_00;
  recursive_directory_iterator __end1;
  int local_144;
  recursive_directory_iterator local_138;
  recursive_directory_iterator local_118;
  recursive_directory_iterator local_100;
  path local_e8;
  recursive_directory_iterator local_a8;
  recursive_directory_iterator local_88;
  path local_70;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_e8,path);
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  recursive_directory_iterator(&local_100,&local_e8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_e8);
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  recursive_directory_iterator(&local_a8,&local_100);
  local_118._M_dirs.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_a8._M_dirs.
            super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_118._M_dirs.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_a8._M_dirs.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_a8._M_dirs.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_a8._M_dirs.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118._M_options = local_a8._M_options;
  local_118._M_pending = local_a8._M_pending;
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  ~recursive_directory_iterator(&local_a8);
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  recursive_directory_iterator(&local_88,&local_100);
  local_138._M_dirs.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_138._M_dirs.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_138._M_options = none;
  local_138._M_pending = false;
  local_138._18_6_ = 0;
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  ~recursive_directory_iterator(&local_88);
  local_144 = 0;
  while (local_118._M_dirs.
         super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi !=
         local_138._M_dirs.
         super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi) {
    this_00 = (path *)std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
                      operator*(&local_118);
    std::experimental::filesystem::v1::__cxx11::path::extension(&local_e8,this_00);
    std::experimental::filesystem::v1::__cxx11::path::
    path<char[6],std::experimental::filesystem::v1::__cxx11::path>(&local_70,(char (*) [6])".flow");
    bVar1 = std::experimental::filesystem::v1::__cxx11::operator==(&local_e8,&local_70);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_e8);
    if (bVar1) {
      flow::diagnostics::BufferedReport::clear(&this->report_);
      std::experimental::filesystem::v1::__cxx11::path::string(&local_e8._M_pathname,this_00);
      bVar1 = testFile(this,&local_e8._M_pathname);
      __x = (double)std::__cxx11::string::~string((string *)&local_e8);
      if (!bVar1) {
        flow::diagnostics::BufferedReport::log(&this->report_,__x);
        local_144 = local_144 + 1;
      }
    }
    std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::operator++(&local_118)
    ;
  }
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  ~recursive_directory_iterator(&local_138);
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  ~recursive_directory_iterator(&local_118);
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  ~recursive_directory_iterator(&local_100);
  return local_144 == 0;
}

Assistant:

bool Tester::testDirectory(const std::string& path) {
  int errorCount = 0;
  for (auto& dir : fs::recursive_directory_iterator(path)) {
    if (dir.path().extension() == ".flow") {
      report_.clear();
      if (!testFile(dir.path().string())) {
        report_.log();
        errorCount++;
      }
    }
  }

  return errorCount == 0;
}